

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

void write_parser_tables_internal
               (Grammar *g,char *base_pathname,char *tag,int binary,FILE *fp,uint8 **str,
               uint *str_len)

{
  byte bVar1;
  Term *pTVar2;
  Production *pPVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  FILE *pFVar10;
  char *pcVar11;
  size_t sVar12;
  ushort **ppuVar13;
  D_Pass *pDVar14;
  char *pcVar15;
  ulong uVar16;
  uint iproduction;
  char *s;
  long lVar17;
  char *e;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  File file;
  char ver_1 [128];
  char ver [128];
  FILE *local_11e0;
  File local_11a8;
  char local_10b8 [128];
  char local_1038 [8];
  undefined4 auStack_1030 [1024];
  
  local_11e0 = (FILE *)fp;
  if ((binary == 0) && (local_11e0 = fopen(g->write_pathname,"w"), local_11e0 == (FILE *)0x0)) {
    local_11e0 = (FILE *)0x0;
    d_fail("unable to open `%s` for write\n");
  }
  if (*g->actions_write_pathname == '\0') {
    pFVar10 = (FILE *)0x0;
  }
  else {
    pFVar10 = fopen(g->actions_write_pathname,"w");
    if (pFVar10 == (FILE *)0x0) {
      pFVar10 = (FILE *)0x0;
      d_fail("unable to open `%s` for write\n");
    }
  }
  memset(&local_11a8,0,0xf0);
  local_11a8.fp = (FILE *)local_11e0;
  local_11a8.str_len = str_len;
  local_11a8.binary = binary;
  local_11a8.actions_fp = (FILE *)pFVar10;
  local_11a8.str = str;
  if (binary != 0) {
    local_11a8.tables.len = 0x400;
    pcVar11 = (char *)malloc(0x400);
    local_11a8.tables.start = pcVar11;
    memset(pcVar11,0,0x400);
    local_11a8.strings.len = 0x400;
    local_11a8.tables.cur = pcVar11;
    pcVar11 = (char *)malloc(0x400);
    local_11a8.strings.start = pcVar11;
    memset(pcVar11,0,0x400);
    local_11a8.strings.cur = pcVar11;
  }
  local_11a8.relocations.n = 0;
  local_11a8.relocations.v = (char **)0x0;
  local_11a8.entries.n = 0;
  local_11a8.entries.v = (OffsetEntry **)0x0;
  local_11a8.str_relocations.n = 0;
  local_11a8.str_relocations.v = (char **)0x0;
  if (binary == 0) {
    uVar18 = (ulong)(g->terminals).n;
    if (uVar18 == 0) {
      bVar4 = false;
    }
    else {
      uVar16 = 0;
      bVar4 = false;
      do {
        if ((g->terminals).v[uVar16]->kind == TERM_TOKEN) {
          bVar4 = true;
        }
        uVar16 = uVar16 + 1;
      } while (uVar18 != uVar16);
    }
    bVar5 = true;
    if (g->states_for_all_nterms == 0) {
      if ((g->productions).n == 0) {
        bVar5 = false;
      }
      else {
        bVar5 = false;
        iproduction = 0;
        do {
          uVar7 = state_for_declaration(g,iproduction);
          if (uVar7 != 0) {
            bVar5 = true;
          }
          iproduction = iproduction + 1;
        } while (iproduction < (g->productions).n);
      }
    }
    if ((0 < g->write_header) || ((bVar6 = true, g->write_header < 0 && (bVar4 || bVar5)))) {
      strcpy(local_1038,base_pathname);
      sVar12 = strlen(local_1038);
      builtin_strncpy(local_1038 + sVar12,".d_parse",8);
      *(undefined4 *)((long)auStack_1030 + sVar12) = 0x682e72;
      pFVar10 = fopen(local_1038,"w");
      if (pFVar10 == (FILE *)0x0) {
        d_fail("unable to open `%s` for write\n",local_1038);
      }
      d_version(local_10b8);
      myfprintf((FILE *)pFVar10,"/*\n  Generated by Make DParser Version %s\n",local_10b8);
      myfprintf((FILE *)pFVar10,"  Available at https://github.com/jplevyak/dparser\n*/\n\n");
      myfprintf((FILE *)pFVar10,"#ifndef _%s_h\n",tag);
      myfprintf((FILE *)pFVar10,"#define _%s_h\n",tag);
      if (bVar4) {
        if (g->token_type == 0) {
          if ((g->terminals).n != 0) {
            uVar18 = 0;
            do {
              pTVar2 = (g->terminals).v[uVar18];
              if (pTVar2->kind == TERM_TOKEN) {
                myfprintf((FILE *)pFVar10,"#define %s \t%d\n",pTVar2->string,
                          (ulong)((g->productions).n + pTVar2->index));
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < (g->terminals).n);
          }
        }
        else {
          myfprintf((FILE *)pFVar10,"enum D_Tokens_%s {\n",tag);
          if ((g->terminals).n != 0) {
            uVar18 = 0;
            uVar19 = 0;
            do {
              pTVar2 = (g->terminals).v[uVar18];
              if (pTVar2->kind == TERM_TOKEN) {
                uVar19 = uVar19 + pTVar2->string_len + 7;
                if (0x46 < uVar19) {
                  putchar(10);
                  uVar19 = 0;
                }
                pTVar2 = (g->terminals).v[uVar18];
                pcVar11 = ", ";
                if (uVar18 == (g->terminals).n - 1) {
                  pcVar11 = "";
                }
                myfprintf((FILE *)pFVar10,"%s = %d%s",pTVar2->string,
                          (ulong)((g->productions).n + pTVar2->index),pcVar11);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < (g->terminals).n);
          }
          myfprintf((FILE *)pFVar10,"\n};\n");
        }
      }
      if ((bVar5) && ((g->productions).n != 0)) {
        uVar18 = 0;
        do {
          pPVar3 = (g->productions).v[uVar18];
          if (((pPVar3->field_0x3c & 0x1c) == 0) && (pPVar3->elem != (Elem *)0x0)) {
            myfprintf((FILE *)pFVar10,"#define D_START_STATE_%s \t%d\n",pPVar3->name,
                      (ulong)pPVar3->state->index);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < (g->productions).n);
      }
      bVar6 = false;
      myfprintf((FILE *)pFVar10,"#endif\n");
      fclose(pFVar10);
    }
    d_version(local_1038);
    myfprintf((FILE *)local_11e0,"/*\n  Generated by Make DParser Version %s\n",local_1038);
    myfprintf((FILE *)local_11e0,"  Available at https://github.com/jplevyak/dparser\n*/\n\n");
    g->write_line = 7;
    pFVar10 = (FILE *)local_11a8.actions_fp;
    if ((FILE *)local_11a8.actions_fp == (FILE *)0x0) {
      pFVar10 = (FILE *)local_11a8.fp;
    }
    if (g->ncode != 0) {
      uVar18 = 0;
LAB_00137253:
      pcVar11 = g->code[uVar18].code;
      if ((g->write_line_directives != 0) && ((FILE *)local_11a8.actions_fp == (FILE *)0x0)) {
        myfprintf((FILE *)pFVar10,"#line %d \"%s\"\n",(ulong)(uint)g->code[uVar18].line,g->pathname)
        ;
        g->write_line = g->write_line + 1;
      }
      if ((FILE *)local_11a8.actions_fp != (FILE *)0x0) {
        pcVar15 = g->pathname;
        uVar19 = g->code[uVar18].line;
        iVar8 = count_newlines(pcVar11);
        myfprintf((FILE *)pFVar10,"%d \"%s\" %d\n",(ulong)uVar19,pcVar15,(ulong)(iVar8 + 1));
      }
LAB_001372e3:
      if (*pcVar11 == '\n') {
        g->write_line = g->write_line + 1;
      }
      else if (*pcVar11 == '\0') goto LAB_00137508;
      if (*pcVar11 == 0x24) {
        iVar8 = (int)uVar18;
        if (pcVar11[1] == '{') {
          pcVar15 = pcVar11 + 2;
          pcVar11 = pcVar11 + 3;
          lVar17 = 0;
          lVar20 = 0;
          while( true ) {
            bVar1 = pcVar15[lVar17];
            if (((bVar1 == 0) || (bVar1 == 0x7d)) ||
               (ppuVar13 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar13 + (ulong)bVar1 * 2 + 1) & 0x20) != 0)) break;
            lVar20 = lVar20 + -1;
            lVar17 = lVar17 + 1;
            pcVar11 = pcVar11 + 1;
          }
          ppuVar13 = __ctype_b_loc();
          uVar19 = (*ppuVar13)[bVar1] >> 0xd & 1;
          s = pcVar15 + -lVar20;
          pcVar11 = pcVar11 + uVar19;
          for (e = s + uVar19; (*e != '\0' && (*e != '}')); e = e + 1) {
            pcVar11 = pcVar11 + 1;
          }
          if (lVar20 == -4) {
            iVar9 = strncasecmp(pcVar15,"pass",4);
            if (iVar9 != 0) goto LAB_00137428;
            pDVar14 = find_pass(g,s,e);
            if (pDVar14 == (D_Pass *)0x0) {
              pcVar15 = dup_str(s,e);
              d_fail("unknown pass \'%s\' line %d",pcVar15,
                     (ulong)(uint)(g->code[uVar18].line + iVar8));
            }
            uVar19 = pDVar14->index;
LAB_001374f7:
            myfprintf((FILE *)pFVar10,"%d",(ulong)uVar19);
          }
          else {
            if (lVar20 == -6) {
              iVar9 = strncasecmp(pcVar15,"string",6);
              if (iVar9 == 0) {
                iVar8 = 4;
                goto LAB_001374e1;
              }
            }
            else if ((lVar20 == -5) && (iVar9 = strncasecmp(pcVar15,"nterm",5), iVar9 == 0)) {
              iVar8 = 1;
LAB_001374e1:
              uVar19 = find_symbol(g,s,e,iVar8);
              goto LAB_001374f7;
            }
LAB_00137428:
            d_fail("bad $ escape in code line %u\n",(ulong)(uint)(g->code[uVar18].line + iVar8));
          }
        }
        else {
          pcVar11 = pcVar11 + 1;
          d_fail("bad $ escape in code line %u\n",(ulong)(uint)(g->code[uVar18].line + iVar8));
        }
      }
      else {
        fputc((int)*pcVar11,pFVar10);
        pcVar11 = pcVar11 + 1;
      }
      goto LAB_001372e3;
    }
LAB_00137533:
    if ((g->write_line_directives != 0) && ((FILE *)local_11a8.actions_fp == (FILE *)0x0)) {
      myfprintf((FILE *)pFVar10,"#line %d \"%s\"\n",(ulong)(uint)g->write_line,g->write_pathname);
      g->write_line = g->write_line + 1;
    }
    myfprintf((FILE *)local_11e0,"#include \"stdlib.h\"\n");
    myfprintf((FILE *)local_11e0,"#include \"dparse.h\"\n");
    g->write_line = g->write_line + 1;
    if (!bVar6) {
      myfprintf((FILE *)local_11e0,"#include \"%s.d_parser.h\"\n",base_pathname);
      g->write_line = g->write_line + 1;
    }
    myfprintf((FILE *)local_11e0,"\n");
    g->write_line = g->write_line + 1;
  }
  write_parser_tables(g,tag,&local_11a8);
  return;
LAB_00137508:
  myfprintf((FILE *)pFVar10,"\n");
  g->write_line = g->write_line + 1;
  uVar18 = uVar18 + 1;
  if (g->ncode <= uVar18) goto LAB_00137533;
  goto LAB_00137253;
}

Assistant:

void write_parser_tables_internal(Grammar *g, char *base_pathname, char *tag, int binary, FILE *fp, uint8 **str,
                                  uint *str_len) {
  File file;
  FILE *actions_fp = NULL;
  if (!binary) {
    fp = fopen(g->write_pathname, "w");
    if (!fp) d_fail("unable to open `%s` for write\n", g->write_pathname);
  }
  if (g->actions_write_pathname[0]) {
    actions_fp = fopen(g->actions_write_pathname, "w");
    if (!actions_fp) d_fail("unable to open `%s` for write\n", g->actions_write_pathname);
  }
  file_init(&file, binary, fp, actions_fp, str, str_len);
  if (!binary) {
    char ver[128];
    int header = write_header(g, base_pathname, tag);
    d_version(ver);
    fprintf(fp, "/*\n  Generated by Make DParser Version %s\n", ver);
    fprintf(fp, "  Available at https://github.com/jplevyak/dparser\n*/\n\n");
    g->write_line = 7;
    write_global_code(&file, g, tag);
    fprintf(fp, "#include \"stdlib.h\"\n");
    fprintf(fp, "#include \"dparse.h\"\n");
    g->write_line++;

    if (header) {
      fprintf(fp, "#include \"%s.d_parser.h\"\n", base_pathname);
      g->write_line++;
    }
    fprintf(fp, "\n");
    g->write_line++;
  }
  write_parser_tables(g, tag, &file);
}